

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LDX_ZP_Y(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  this->cycles = 4;
  uVar1 = GetByte(this);
  this->cycles = this->cycles - 1;
  bVar2 = ReadByte(this,(ushort)(byte)(uVar1 + this->Y));
  this->X = bVar2;
  (this->field_6).ps = bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDX_ZP_Y()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += Y;
    cycles--;
    X = ReadByte(data);
    Z = (X == 0);
    N = (X & 0b10000000) > 0;
}